

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

Gia_Man_t *
Wlc_NtkUnrollWithCex
          (Wlc_Ntk_t *pChoice,Abc_Cex_t *pCex,int nbits_old_pis,int num_sel_pis,int *p_num_ppis,
          int sel_pi_first,int fUsePPI)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Man_t *p;
  Gia_Man_t *p_00;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  bool bVar9;
  Gia_Man_t *pGia;
  int local_68;
  int is_sel_pi;
  int i;
  int f;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObj;
  Gia_Man_t *pFrames;
  int num_undc_pis;
  int num_ppis;
  int nbits_new_pis;
  Gia_Man_t *pGiaChoice;
  int sel_pi_first_local;
  int *p_num_ppis_local;
  int num_sel_pis_local;
  int nbits_old_pis_local;
  Abc_Cex_t *pCex_local;
  Wlc_Ntk_t *pChoice_local;
  
  p = Wlc_NtkBitBlast(pChoice,(Wlc_BstPar_t *)0x0);
  iVar1 = Wlc_NtkNumPiBits(pChoice);
  uVar2 = (iVar1 - nbits_old_pis) - num_sel_pis;
  iVar3 = Gia_ManPiNum(p);
  uVar4 = iVar3 - iVar1;
  *p_num_ppis = uVar2;
  Abc_Print(1,"#orig_pis = %d, #ppis = %d, #sel_pis = %d, #undc_pis = %d\n",
            (ulong)(uint)nbits_old_pis,(ulong)uVar2,(ulong)(uint)num_sel_pis,(ulong)uVar4);
  iVar1 = Gia_ManPiNum(p);
  if (iVar1 != nbits_old_pis + uVar2 + num_sel_pis + uVar4) {
    __assert_fail("Gia_ManPiNum(pGiaChoice)==nbits_old_pis+num_ppis+num_sel_pis+num_undc_pis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs.c"
                  ,0x17d,
                  "Gia_Man_t *Wlc_NtkUnrollWithCex(Wlc_Ntk_t *, Abc_Cex_t *, int, int, int *, int, int)"
                 );
  }
  iVar1 = Gia_ManPiNum(p);
  if (iVar1 != pCex->nPis + num_sel_pis) {
    __assert_fail("Gia_ManPiNum(pGiaChoice)==pCex->nPis+num_sel_pis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs.c"
                  ,0x17e,
                  "Gia_Man_t *Wlc_NtkUnrollWithCex(Wlc_Ntk_t *, Abc_Cex_t *, int, int, int *, int, int)"
                 );
  }
  p_00 = Gia_ManStart(10000);
  pcVar6 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar6;
  Gia_ManHashAlloc(p_00);
  pGVar7 = Gia_ManConst0(p);
  pGVar7->Value = 0;
  local_68 = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar9 = false;
    if (local_68 < iVar1) {
      iVar1 = Gia_ManPoNum(p);
      pObjRi = Gia_ManCo(p,iVar1 + local_68);
      bVar9 = pObjRi != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    pObjRi->Value = 0;
    local_68 = local_68 + 1;
  }
  for (is_sel_pi = 0; is_sel_pi <= pCex->iFrame; is_sel_pi = is_sel_pi + 1) {
    for (local_68 = 0; iVar1 = Gia_ManPiNum(p), local_68 < iVar1; local_68 = local_68 + 1) {
      if ((local_68 < nbits_old_pis) || ((int)(nbits_old_pis + uVar2 + num_sel_pis) <= local_68)) {
        if (local_68 < nbits_old_pis) {
          uVar5 = Abc_InfoHasBit((uint *)(pCex + 1),pCex->nRegs + pCex->nPis * is_sel_pi + local_68)
          ;
          pGVar7 = Gia_ManPi(p,local_68);
          pGVar7->Value = uVar5;
        }
        else if ((int)(nbits_old_pis + uVar2 + num_sel_pis) <= local_68) {
          uVar5 = Abc_InfoHasBit((uint *)(pCex + 1),
                                 ((pCex->nRegs + pCex->nPis * is_sel_pi + local_68) - num_sel_pis) -
                                 uVar2);
          pGVar7 = Gia_ManPi(p,local_68);
          pGVar7->Value = uVar5;
        }
      }
      else {
        if (sel_pi_first == 0) {
          bVar9 = (int)(nbits_old_pis + uVar2) <= local_68;
        }
        else {
          bVar9 = local_68 < nbits_old_pis + num_sel_pis;
        }
        if ((is_sel_pi == 0) && (bVar9)) {
          uVar5 = Gia_ManAppendCi(p_00);
          pGVar7 = Gia_ManPi(p,local_68);
          pGVar7->Value = uVar5;
        }
        if (!bVar9) {
          if (fUsePPI == 0) {
            uVar5 = Gia_ManAppendCi(p_00);
            pGVar7 = Gia_ManPi(p,local_68);
            pGVar7->Value = uVar5;
          }
          else {
            uVar5 = Abc_InfoHasBit((uint *)(pCex + 1),
                                   pCex->nRegs + pCex->nPis * is_sel_pi + local_68 + uVar4);
            pGVar7 = Gia_ManPi(p,local_68);
            pGVar7->Value = uVar5;
          }
        }
      }
    }
    local_68 = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar9 = false;
      if (local_68 < iVar1) {
        iVar1 = Gia_ManPoNum(p);
        _i = Gia_ManCo(p,iVar1 + local_68);
        bVar9 = false;
        if (_i != (Gia_Obj_t *)0x0) {
          iVar1 = Gia_ManPiNum(p);
          pObjRi = Gia_ManCi(p,iVar1 + local_68);
          bVar9 = pObjRi != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar9) break;
      pObjRi->Value = _i->Value;
      local_68 = local_68 + 1;
    }
    local_68 = 0;
    while( true ) {
      bVar9 = false;
      if (local_68 < p->nObjs) {
        pObjRi = Gia_ManObj(p,local_68);
        bVar9 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      iVar1 = Gia_ObjIsAnd(pObjRi);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFanin0Copy(pObjRi);
        iVar3 = Gia_ObjFanin1Copy(pObjRi);
        uVar5 = Gia_ManHashAnd(p_00,iVar1,iVar3);
        pObjRi->Value = uVar5;
      }
      local_68 = local_68 + 1;
    }
    local_68 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar9 = false;
      if (local_68 < iVar1) {
        pObjRi = Gia_ManCo(p,local_68);
        bVar9 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      uVar5 = Gia_ObjFanin0Copy(pObjRi);
      pObjRi->Value = uVar5;
      local_68 = local_68 + 1;
    }
    local_68 = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(p);
      bVar9 = false;
      if (local_68 < iVar1) {
        pObjRi = Gia_ManCo(p,local_68);
        bVar9 = pObjRi != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      Gia_ManAppendCo(p_00,pObjRi->Value);
      local_68 = local_68 + 1;
    }
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,0);
  pGVar8 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  Gia_ManStop(p);
  return pGVar8;
}

Assistant:

static Gia_Man_t * Wlc_NtkUnrollWithCex(Wlc_Ntk_t * pChoice, Abc_Cex_t * pCex, int nbits_old_pis, int num_sel_pis, int * p_num_ppis, int sel_pi_first, int fUsePPI) 
{
    Gia_Man_t * pGiaChoice = Wlc_NtkBitBlast( pChoice, NULL );
    int nbits_new_pis = Wlc_NtkNumPiBits( pChoice );
    int num_ppis = nbits_new_pis - nbits_old_pis - num_sel_pis;
    int num_undc_pis = Gia_ManPiNum(pGiaChoice) - nbits_new_pis;
    Gia_Man_t * pFrames = NULL;
    Gia_Obj_t * pObj, * pObjRi;
    int f, i;
    int is_sel_pi;
    Gia_Man_t * pGia;
    *p_num_ppis = num_ppis;

    Abc_Print( 1, "#orig_pis = %d, #ppis = %d, #sel_pis = %d, #undc_pis = %d\n", nbits_old_pis, num_ppis, num_sel_pis, num_undc_pis );
    assert(Gia_ManPiNum(pGiaChoice)==nbits_old_pis+num_ppis+num_sel_pis+num_undc_pis);
    assert(Gia_ManPiNum(pGiaChoice)==pCex->nPis+num_sel_pis);

    pFrames = Gia_ManStart( 10000 );
    pFrames->pName = Abc_UtilStrsav( pGiaChoice->pName );
    Gia_ManHashAlloc( pFrames );
    Gia_ManConst0(pGiaChoice)->Value = 0;
    Gia_ManForEachRi( pGiaChoice, pObj, i )
        pObj->Value = 0;

    for ( f = 0; f <= pCex->iFrame; f++ ) 
    {
        for( i = 0; i < Gia_ManPiNum(pGiaChoice); i++ ) 
        {
            if ( i >= nbits_old_pis && i < nbits_old_pis + num_ppis + num_sel_pis ) 
            {
                is_sel_pi = sel_pi_first ? (i < nbits_old_pis + num_sel_pis) : (i >= nbits_old_pis + num_ppis);
                if( f == 0 && is_sel_pi )
                    Gia_ManPi(pGiaChoice, i)->Value = Gia_ManAppendCi(pFrames);
                if( !is_sel_pi )
                {
                    if ( !fUsePPI )
                        Gia_ManPi(pGiaChoice, i)->Value = Gia_ManAppendCi(pFrames);
                    else
                        Gia_ManPi(pGiaChoice, i)->Value = Abc_InfoHasBit(pCex->pData, pCex->nRegs+pCex->nPis*f + i + num_undc_pis);
                }
            } 
            else if (i < nbits_old_pis) 
            {
                Gia_ManPi(pGiaChoice, i)->Value = Abc_InfoHasBit(pCex->pData, pCex->nRegs+pCex->nPis*f + i);
            } 
            else if (i >= nbits_old_pis + num_ppis + num_sel_pis) 
            {
                Gia_ManPi(pGiaChoice, i)->Value = Abc_InfoHasBit(pCex->pData, pCex->nRegs+pCex->nPis*f + i - num_sel_pis - num_ppis);
            }
        }
        Gia_ManForEachRiRo( pGiaChoice, pObjRi, pObj, i )
            pObj->Value = pObjRi->Value;
        Gia_ManForEachAnd( pGiaChoice, pObj, i )
            pObj->Value = Gia_ManHashAnd(pFrames, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj));
        Gia_ManForEachCo( pGiaChoice, pObj, i )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        Gia_ManForEachPo( pGiaChoice, pObj, i )
            Gia_ManAppendCo(pFrames, pObj->Value);
    }
    Gia_ManHashStop (pFrames);
    Gia_ManSetRegNum(pFrames, 0);
    pFrames = Gia_ManCleanup(pGia = pFrames);
    Gia_ManStop(pGia);
    Gia_ManStop(pGiaChoice);

    return pFrames;
}